

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sha256.cpp
# Opt level: O1

void Sha256::Private::WriteByteBlock(Sha256 *p)

{
  uint uVar1;
  long lVar2;
  UInt32 data32 [16];
  uint auStack_73 [8];
  undefined8 uStack_50;
  UInt32 local_48 [18];
  
  lVar2 = 0x2b;
  do {
    uVar1 = *(uint *)((long)p->state + lVar2 + -3);
    *(uint *)((long)auStack_73 + lVar2) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x6b);
  uStack_50 = 0x106f27;
  Transform(p->state,local_48);
  return;
}

Assistant:

static void WriteByteBlock(Sha256* p)
  {
    UInt32 data32[16];
    unsigned i;
    for (i = 0; i < 16; i++)
      data32[i] =
        ((UInt32)(p->buffer[i * 4    ]) << 24) +
        ((UInt32)(p->buffer[i * 4 + 1]) << 16) +
        ((UInt32)(p->buffer[i * 4 + 2]) <<  8) +
        ((UInt32)(p->buffer[i * 4 + 3]));
    Transform(p->state, data32);
  }